

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O1

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_five(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this)

{
  pointer pIVar1;
  Index IVar2;
  pointer pVVar3;
  pointer pAVar4;
  pointer pAVar5;
  Index col;
  Index row;
  Index local_30;
  unsigned_long local_28;
  
  do {
    pIVar1 = (this->path_).
             super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    IVar2 = pIVar1[-1].col;
    pVVar3 = (this->graph_->vertices_).
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar5 = *(pointer *)&pVVar3[IVar2].from_;
    pAVar4 = *(pointer *)((long)(pVVar3 + IVar2) + 8);
    local_28 = 0xffffffffffffffff;
    if (pAVar5 != pAVar4) {
      do {
        if ((this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[pAVar5->edge_] == 1) {
          local_28 = pAVar5->vertex_;
          break;
        }
        pAVar5 = pAVar5 + 1;
      } while (pAVar5 != pAVar4);
    }
    if (local_28 == 0xffffffffffffffff) {
      augment(this);
      clear_covers(this);
      erase_primes(this);
      this->step_ = THREE;
      return;
    }
    std::
    vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
    ::emplace_back<unsigned_long&,unsigned_long&>
              ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                *)&this->path_,&local_28,&pIVar1[-1].col);
    local_30 = find_prime_in_row(this,(this->path_).
                                      super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                                      ._M_impl.super__Vector_impl_data._M_finish[-1].row);
    std::
    vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
    ::emplace_back<unsigned_long&,unsigned_long_const&>
              ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                *)&this->path_,
               &(this->path_).
                super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].row,&local_30);
  } while( true );
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_five()
{
    Index row;
    while (true) {
        row = find_star_in_col(path_.back().col);
        if (row == IDXMAX) {
            break;
        }

        path_.emplace_back(row, path_.back().col);

        auto const col = find_prime_in_row(path_.back().row);
        path_.emplace_back(path_.back().row, col);
    }

    augment();
    clear_covers();
    erase_primes();
    step_ = Step::THREE;
}